

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal2jd.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<double> __l;
  ostream *poVar1;
  reference pvVar2;
  long in_RSI;
  int in_EDI;
  double dVar3;
  vector<double,_std::allocator<double>_> *this;
  iterator pdVar4;
  vector<double,_std::allocator<double>_> gregorian_vect;
  double day;
  double month;
  double year;
  double jd;
  size_t *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  double dVar5;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type *__a;
  allocator *this_01;
  char *pcVar6;
  allocator *__x;
  undefined1 local_148 [32];
  vector<double,_std::allocator<double>_> *local_128;
  iterator local_120;
  double local_118;
  undefined8 local_110;
  vector<double,_std::allocator<double>_> **local_108;
  undefined8 local_100;
  vector<double,_std::allocator<double>_> local_f8;
  allocator local_d9;
  string local_d8 [32];
  double local_b8;
  allocator local_a9;
  string local_a8 [32];
  iterator local_88;
  allocator local_79;
  string local_78 [32];
  vector<double,_std::allocator<double>_> *local_58;
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  long local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_18 = 0;
  if ((in_EDI == 2) || (in_EDI == 4)) {
    if (in_EDI == 2) {
      pcVar6 = *(char **)(in_RSI + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar6,&local_39);
      dVar3 = std::__cxx11::stod(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_18 = CEDate::Gregorian2JD(dVar3);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else if (in_EDI == 4) {
      pcVar6 = *(char **)(in_RSI + 8);
      local_10 = in_RSI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar6,&local_79);
      this = (vector<double,_std::allocator<double>_> *)
             std::__cxx11::stod(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      pcVar6 = *(char **)(local_10 + 0x10);
      __x = &local_a9;
      local_58 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar6,__x);
      pdVar4 = (iterator)std::__cxx11::stod(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      __a = *(allocator_type **)(local_10 + 0x18);
      this_01 = &local_d9;
      local_88 = pdVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,(char *)__a,this_01);
      dVar3 = std::__cxx11::stod(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      local_128 = local_58;
      local_120 = local_88;
      local_b8 = dVar3;
      local_118 = floor(dVar3);
      local_110 = 0;
      local_108 = &local_128;
      local_100 = 4;
      std::allocator<double>::allocator((allocator<double> *)0x1036fc);
      __l._M_len = (size_type)pcVar6;
      __l._M_array = pdVar4;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)this_01,__l,__a);
      std::allocator<double>::~allocator((allocator<double> *)0x10372d);
      this_00 = &local_f8;
      dVar5 = local_b8;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,3);
      *pvVar2 = dVar5 - dVar3;
      std::vector<double,_std::allocator<double>_>::vector
                (this,(vector<double,_std::allocator<double>_> *)__x);
      local_18 = CEDate::GregorianVect2JD(local_148);
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
    }
    printf("%f\n",local_18);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"cal2jd v");
    poVar1 = std::operator<<(poVar1,"1.3.0");
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cout,"\nUSAGE: May be called in one of two ways:\n");
    std::operator<<((ostream *)&std::cout,"    1: cal2jd YYYYMMDD.<day fraction>\n");
    std::operator<<((ostream *)&std::cout,"    2: cal2jd <year> <month> <day>.<day fraction>\n");
    std::operator<<((ostream *)&std::cout,"RETURNED: Julian Date\n\n");
  }
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
    
    // variable to hold the julian date
    double jd(0.0) ;
    
    // Check that we've been passed an actual argument
    if ((argc != 2)&&(argc != 4)) {
        // Print some usage information
        std::cout << "cal2jd v" << CPPEPHEM_VERSION << "\n";
        std::cout << "\nUSAGE: May be called in one of two ways:\n";
        std::cout << "    1: cal2jd YYYYMMDD.<day fraction>\n" ;
        std::cout << "    2: cal2jd <year> <month> <day>.<day fraction>\n" ;
        std::cout << "RETURNED: Julian Date\n\n" ;
        return 0 ;
    } else if (argc == 2) {
        jd = CEDate::Gregorian2JD(std::stod(argv[1])) ;
    } else if (argc == 4) {
        // First get the year, month, day information from the pass parameters
        double year(std::stod(argv[1]));
        double month(std::stod(argv[2]));
        double day(std::stod(argv[3]));
        std::vector<double> gregorian_vect = {year, month, std::floor(day), 0.0} ;
        gregorian_vect[3] = day - gregorian_vect[2] ;
                
        // Now compute the julian date
        jd = CEDate::GregorianVect2JD(gregorian_vect) ;
    }
    
    // Print the result
    std::printf("%f\n", jd) ;
    
    return 0 ;
}